

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O1

void __thiscall MemoryProfiler::MemoryProfiler(MemoryProfiler *this)

{
  DWORD DVar1;
  HANDLE processHandle;
  
  processHandle = GetCurrentProcess();
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::PageAllocatorBase(&this->pageAllocator,(AllocationPolicyManager *)0x0,
                      (ConfigFlagsTable *)&Js::Configuration::Global,PageAllocatorType_Max,0,false,
                      (BackgroundPageQueue *)0x0,0x20,0,false,false,processHandle,false);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&(this->alloc).super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
             ,L"MemoryProfiler",&this->pageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  (this->arenaDataMap).buckets = (Type)0x0;
  (this->arenaDataMap).entries = (Type)0x0;
  (this->arenaDataMap).alloc = &this->alloc;
  (this->arenaDataMap).size = 0;
  (this->arenaDataMap).bucketCount = 0;
  (this->arenaDataMap).count = 0;
  (this->arenaDataMap).freeCount = 0;
  (this->arenaDataMap).modFunctionIndex = 0x4b;
  (this->arenaDataMap).stats = (Type)0x0;
  JsUtil::
  BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Initialize(&this->arenaDataMap,10);
  DVar1 = GetCurrentThreadId();
  this->threadId = DVar1;
  memset(this->pageMemoryData,0,0x200);
  return;
}

Assistant:

MemoryProfiler::MemoryProfiler() :
    pageAllocator(nullptr, Js::Configuration::Global.flags,
    PageAllocatorType_Max, 0, false
#if ENABLE_BACKGROUND_PAGE_FREEING
        , nullptr
#endif
        ),
    alloc(_u("MemoryProfiler"), &pageAllocator, Js::Throw::OutOfMemory),
    arenaDataMap(&alloc, 10)
{
    threadId = ::GetCurrentThreadId();
    memset(&pageMemoryData, 0, sizeof(pageMemoryData));
    memset(&recyclerMemoryData, 0, sizeof(recyclerMemoryData));
}